

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

QRect __thiscall QPlainTextEdit::cursorRect(QPlainTextEdit *this)

{
  QPlainTextEditPrivate *this_00;
  int iVar1;
  long in_FS_OFFSET;
  qreal qVar2;
  QRect QVar3;
  QRect QVar4;
  QRectF QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QPlainTextEditControl::cursorRect(&QStack_48,this_00->control);
  QVar3 = QRectF::toRect(&QStack_48);
  iVar1 = QPlainTextEditPrivate::horizontalOffset(this_00);
  qVar2 = QPlainTextEditPrivate::verticalOffset(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QVar4.y1.m_i = QVar3.y1.m_i.m_i - (int)qVar2;
    QVar4.x1.m_i = QVar3.x1.m_i.m_i - iVar1;
    QVar4.y2.m_i = QVar3.y2.m_i.m_i - (int)qVar2;
    QVar4.x2.m_i = QVar3.x2.m_i.m_i - iVar1;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPlainTextEdit::cursorRect() const
{
    Q_D(const QPlainTextEdit);
    QRect r = d->control->cursorRect().toRect();
    r.translate(-d->horizontalOffset(),-(int)d->verticalOffset());
    return r;
}